

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O2

void h2v1_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  JDIMENSION JVar2;
  JSAMPARRAY ppJVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  ppJVar3 = *output_data_ptr;
  for (lVar6 = 0; lVar6 < cinfo->max_v_samp_factor; lVar6 = lVar6 + 1) {
    pbVar4 = input_data[lVar6];
    pbVar5 = ppJVar3[lVar6];
    bVar1 = *pbVar4;
    *pbVar5 = bVar1;
    pbVar5[1] = (byte)((uint)bVar1 + (uint)bVar1 * 2 + (uint)pbVar4[1] + 2 >> 2);
    JVar2 = compptr->downsampled_width;
    for (lVar8 = 0; JVar2 - 2 != (int)lVar8; lVar8 = lVar8 + 1) {
      iVar7 = (uint)pbVar4[lVar8 + 1] + (uint)pbVar4[lVar8 + 1] * 2;
      pbVar5[lVar8 * 2 + 2] = (byte)((uint)pbVar4[lVar8] + iVar7 + 1 >> 2);
      pbVar5[lVar8 * 2 + 3] = (byte)(iVar7 + (uint)pbVar4[lVar8 + 2] + 2 >> 2);
    }
    bVar1 = pbVar4[lVar8 + 1];
    pbVar5[lVar8 * 2 + 2] = (byte)((uint)pbVar4[lVar8] + (uint)bVar1 + (uint)bVar1 * 2 + 1 >> 2);
    pbVar5[lVar8 * 2 + 3] = bVar1;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register int invalue;
  register JDIMENSION colctr;
  int inrow;

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    inptr = input_data[inrow];
    outptr = output_data[inrow];
    /* Special case for first column */
    invalue = *inptr++;
    *outptr++ = (JSAMPLE)invalue;
    *outptr++ = (JSAMPLE)((invalue * 3 + inptr[0] + 2) >> 2);

    for (colctr = compptr->downsampled_width - 2; colctr > 0; colctr--) {
      /* General case: 3/4 * nearer pixel + 1/4 * further pixel */
      invalue = (*inptr++) * 3;
      *outptr++ = (JSAMPLE)((invalue + inptr[-2] + 1) >> 2);
      *outptr++ = (JSAMPLE)((invalue + inptr[0] + 2) >> 2);
    }

    /* Special case for last column */
    invalue = *inptr;
    *outptr++ = (JSAMPLE)((invalue * 3 + inptr[-1] + 1) >> 2);
    *outptr++ = (JSAMPLE)invalue;
  }
}